

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddSlotArrayDebuggerScopeProperties
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,DebuggerScope *debuggerScope,
          uint propertiesCount)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  PropertyId PVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  Type *pTVar7;
  int index;
  uint32 uVar8;
  
  if (debuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x6d6,"(debuggerScope)","debuggerScope");
    if (!bVar2) goto LAB_00891d00;
    *puVar6 = 0;
  }
  if (propertiesCount == 0) {
    uVar8 = 0;
  }
  else {
    bVar2 = DebuggerScope::HasProperties(debuggerScope);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x6e2,"(debuggerScope->HasProperties())",
                                  "Properties should exist.");
      if (!bVar2) goto LAB_00891d00;
      *puVar6 = 0;
    }
    if ((((debuggerScope->scopeProperties).ptr)->
        super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).count < 0)
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x6e3,"(debuggerScope->scopeProperties->Count() >= 0)",
                                  "debuggerScope->scopeProperties->Count() >= 0");
      if (!bVar2) goto LAB_00891d00;
      *puVar6 = 0;
    }
    if ((((debuggerScope->scopeProperties).ptr)->
        super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).count !=
        propertiesCount) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x6e4,
                                  "((uint)debuggerScope->scopeProperties->Count() == propertiesCount)"
                                  ,"Property counts should match.");
      if (!bVar2) {
LAB_00891d00:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    uVar8 = 0;
    index = 0;
    do {
      pTVar7 = JsUtil::
               List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((debuggerScope->scopeProperties).ptr,index);
      PVar4 = pTVar7->propId;
      uVar3 = PrependInt32(this,builder,L"SlotIndexesForDebuggerScopeSlots",pTVar7->location,
                           (BufferBuilderInt32 **)0x0);
      PVar4 = encodePossiblyBuiltInPropertyId(this,PVar4);
      uVar5 = PrependInt32(this,builder,L"PropertyIdsForDebuggerScopeSlots",PVar4,
                           (BufferBuilderInt32 **)0x0);
      uVar8 = uVar5 + uVar3 + uVar8;
      index = index + 1;
    } while (propertiesCount + (propertiesCount == 0) != index);
  }
  return uVar8;
}

Assistant:

uint32 AddSlotArrayDebuggerScopeProperties(BufferBuilderList & builder, DebuggerScope* debuggerScope, uint propertiesCount)
    {
        Assert(debuggerScope);
        if (propertiesCount == 0)
        {
            return 0u;
        }

        uint32 size = 0u;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start SlotArrayDebuggerScopeProperties"), magicStartOfDebuggerScopeProperties);
#endif // BYTE_CODE_MAGIC_CONSTANTS

        AssertMsg(debuggerScope->HasProperties(), "Properties should exist.");
        Assert(debuggerScope->scopeProperties->Count() >= 0);
        AssertMsg((uint)debuggerScope->scopeProperties->Count() == propertiesCount, "Property counts should match.");
        for (uint i = 0u; i < propertiesCount; ++i)
        {
            DebuggerScopeProperty scopeProperty = debuggerScope->scopeProperties->Item(i);
            size += PrependInt32(builder, _u("SlotIndexesForDebuggerScopeSlots"), scopeProperty.location);

            PropertyId propertyId = encodePossiblyBuiltInPropertyId(scopeProperty.propId);
            size += PrependInt32(builder, _u("PropertyIdsForDebuggerScopeSlots"), propertyId);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End SlotArrayDebuggerScopeProperties"), magicEndOfDebuggerScopeProperties);
#endif // BYTE_CODE_MAGIC_CONSTANTS

        return size;
    }